

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
::
ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::LinearExprHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
           *this,int num_terms)

{
  BinaryReaderBase *this_00;
  
  if (0 < num_terms) {
    do {
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
      ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *)this,**(uint **)(this + 8));
      this_00 = *(BinaryReaderBase **)this;
      (this_00->super_ReaderBase).token_ = (this_00->super_ReaderBase).ptr_;
      BinaryReaderBase::Read(this_00,8);
      num_terms = num_terms + -1;
    } while (num_terms != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}